

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O2

void __thiscall
Assimp::FileSystemFilter::FileSystemFilter(FileSystemFilter *this,string *file,IOSystem *old)

{
  string *__rhs;
  char cVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  Logger *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (this->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__FileSystemFilter_002449c0;
  this->mWrapped = old;
  std::__cxx11::string::string((string *)&this->mSrc_file,(string *)file);
  (this->mBase)._M_dataplus._M_p = (pointer)&(this->mBase).field_2;
  (this->mBase)._M_string_length = 0;
  __rhs = &this->mBase;
  (this->mBase).field_2._M_local_buf[0] = '\0';
  iVar3 = (*this->mWrapped->_vptr_IOSystem[3])();
  this->mSep = (char)iVar3;
  if (this->mWrapped == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/FileSystemFilter.h"
                  ,0x47,
                  "Assimp::FileSystemFilter::FileSystemFilter(const std::string &, IOSystem *)");
  }
  std::__cxx11::string::_M_assign((string *)__rhs);
  uVar4 = std::__cxx11::string::find_last_of((char *)__rhs,0x1cca40);
  if (uVar4 == 0xffffffffffffffff) {
    std::__cxx11::string::assign((char *)__rhs);
  }
  else {
    std::__cxx11::string::erase((ulong)__rhs,uVar4);
  }
  sVar2 = (this->mBase)._M_string_length;
  if (sVar2 == 0) {
    std::__cxx11::string::assign((char *)__rhs);
  }
  else {
    cVar1 = (__rhs->_M_dataplus)._M_p[sVar2 - 1];
    if ((cVar1 == '/') || (cVar1 == '\\')) goto LAB_001366b1;
  }
  (*(this->super_IOSystem)._vptr_IOSystem[3])(this);
  std::__cxx11::string::push_back((char)__rhs);
LAB_001366b1:
  this_00 = DefaultLogger::get();
  std::operator+(&local_60,"Import root directory is \'",__rhs);
  std::operator+(&local_40,&local_60,"\'");
  Logger::info(this_00,local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

FileSystemFilter(const std::string& file, IOSystem* old)
    : mWrapped  (old)
    , mSrc_file(file)
    , mSep(mWrapped->getOsSeparator()) {
        ai_assert(nullptr != mWrapped);

        // Determine base directory
        mBase = mSrc_file;
        std::string::size_type ss2;
        if (std::string::npos != (ss2 = mBase.find_last_of("\\/")))  {
            mBase.erase(ss2,mBase.length()-ss2);
        } else {
            mBase = "";
        }

        // make sure the directory is terminated properly
        char s;

        if ( mBase.empty() ) {
            mBase = ".";
            mBase += getOsSeparator();
        } else if ((s = *(mBase.end()-1)) != '\\' && s != '/') {
            mBase += getOsSeparator();
        }

        DefaultLogger::get()->info("Import root directory is \'" + mBase + "\'");
    }